

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

Elem * new_utf8_char(Grammar *g,char *s,char *e,Rule *r)

{
  byte bVar1;
  ulong in_RAX;
  Elem *pEVar2;
  long lVar3;
  char *e_00;
  ulong uVar4;
  ulong uVar5;
  char utf8_code [4];
  undefined8 uStack_18;
  
  e_00 = &stack0xfffffffffffffff0;
  if (e < s + 3) {
    uVar4 = 0;
  }
  else {
    lVar3 = 1;
    uVar4 = 0;
    do {
      bVar1 = e[-1];
      if ((byte)(bVar1 - 0x30) < 10) {
        uVar5 = (ulong)(byte)(bVar1 - 0x30);
LAB_00138cd0:
        uVar4 = uVar4 + uVar5 * lVar3;
      }
      else if (((byte)(bVar1 + 0x9f) < 6) || ((byte)(bVar1 + 0xbf) < 6)) {
        uVar5 = (ulong)(bVar1 + 9 & 0x1f);
        goto LAB_00138cd0;
      }
      e = e + -1;
      lVar3 = lVar3 << 4;
    } while (s + 3 <= e);
  }
  uStack_18 = in_RAX;
  if (uVar4 < 0x80) {
    e_00 = (char *)((long)&uStack_18 + 5);
  }
  else {
    if (uVar4 < 0x800) {
      e_00 = (char *)((long)&uStack_18 + 6);
      bVar1 = (byte)(uVar4 >> 6) | 0xc0;
    }
    else {
      if (uVar4 < 0x10000) {
        e_00 = (char *)((long)&uStack_18 + 7);
        bVar1 = (byte)(uVar4 >> 0xc) | 0xe0;
      }
      else {
        if (0x1ffffff < uVar4) {
          d_fail(
                "UTF32 Unicode value U+%8X too large for valid UTF-8 encoding (cf. Unicode Spec 4.0, section 3.9)"
                );
          e_00 = (char *)((long)&uStack_18 + 4);
          goto LAB_00138d5c;
        }
        uStack_18._5_3_ = (undefined3)(in_RAX >> 0x28);
        uStack_18._0_4_ = (undefined4)in_RAX;
        uStack_18 = CONCAT35(uStack_18._5_3_,CONCAT14((char)(uVar4 >> 0x12),(undefined4)uStack_18))
                    & 0xffffff07ffffffff | 0xf000000000;
        bVar1 = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
      }
      e_00[-3] = bVar1;
      bVar1 = (byte)(uVar4 >> 6) & 0x3f | 0x80;
    }
    e_00[-2] = bVar1;
    uVar4 = (ulong)((byte)uVar4 & 0x3f | 0x80);
  }
  e_00[-1] = (char)uVar4;
LAB_00138d5c:
  pEVar2 = new_term_string(g,(char *)((long)&uStack_18 + 4),e_00,r);
  ((pEVar2->e).term)->kind = TERM_STRING;
  return pEVar2;
}

Assistant:

Elem *new_utf8_char(Grammar *g, char *s, char *e, Rule *r) {
  char utf8_code[4];
  unsigned long utf32_code, base, len = 0;
  Elem *x;
  for (utf32_code = 0, base = 1; e >= s + 3; base *= 16) {
    e--;
    if (*e >= '0' && *e <= '9')
      utf32_code += base * (*e - '0');
    else if (*e >= 'a' && *e <= 'f')
      utf32_code += base * (*e - 'a' + 10);
    else if (*e >= 'A' && *e <= 'F')
      utf32_code += base * (*e - 'A' + 10);
  }
  if (utf32_code < 0x80) {
    utf8_code[0] = utf32_code;
    len = 1;
  } else if (utf32_code < 0x800) {
    utf8_code[0] = 0xc0 | ((utf32_code >> 6) & 0x1f);
    utf8_code[1] = 0x80 | (utf32_code & 0x3f);
    len = 2;
  } else if (utf32_code < 0x10000) {
    utf8_code[0] = 0xe0 | ((utf32_code >> 12) & 0x0f);
    utf8_code[1] = 0x80 | ((utf32_code >> 6) & 0x3f);
    utf8_code[2] = 0x80 | (utf32_code & 0x3f);
    len = 3;
  } else if (utf32_code < 0x02000000) {
    utf8_code[0] = 0xf0 | ((utf32_code >> 18) & 0x07);
    utf8_code[1] = 0x80 | ((utf32_code >> 12) & 0x3f);
    utf8_code[2] = 0x80 | ((utf32_code >> 6) & 0x3f);
    utf8_code[3] = 0x80 | (utf32_code & 0x3f);
    len = 4;
  } else {
    d_fail("UTF32 Unicode value U+%8X too large for valid UTF-8 encoding (cf. Unicode Spec 4.0, section 3.9)",
           utf32_code);
  }
  x = new_term_string(g, utf8_code, utf8_code + len, r);
  x->e.term->kind = TERM_STRING;
  return x;
}